

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_AccS(int optype,void *scale,void *src_ptr,int *src_stride_arr,void *dst_ptr,
               int *dst_stride_arr,int *count,int stride_levels,int proc)

{
  int iVar1;
  int *in_RCX;
  comex_group_t in_EDX;
  undefined8 in_R8;
  int datatype;
  int *in_R9;
  int *in_stack_00000008;
  int in_stack_00000010;
  int lcount;
  int i;
  int iret;
  undefined4 in_stack_00000058;
  int in_stack_00000064;
  comex_group_t in_stack_00000088;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffc4;
  
  datatype = (int)((ulong)in_R8 >> 0x20);
  iVar1 = armci_check_contiguous(in_RCX,in_R9,in_stack_00000008,in_stack_00000010);
  if (iVar1 == 0) {
    iVar1 = comex_accs(in_stack_00000064,(void *)CONCAT44(optype,in_stack_00000058),scale,
                       (int *)src_ptr,src_stride_arr,(int *)dst_ptr,count,stride_levels,proc,
                       in_stack_00000088);
  }
  else {
    iVar1 = 1;
    for (iVar2 = 0; iVar2 <= in_stack_00000010; iVar2 = iVar2 + 1) {
      iVar1 = in_stack_00000008[iVar2] * iVar1;
    }
    iVar1 = comex_acc(datatype,in_R9,(void *)CONCAT44(in_stack_ffffffffffffffc4,iVar2),
                      (void *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb4,
                      in_stack_ffffffffffffffb0,in_EDX);
  }
  return iVar1;
}

Assistant:

int PARMCI_AccS(int optype, void *scale, void *src_ptr, int *src_stride_arr, void *dst_ptr, int *dst_stride_arr, int *count, int stride_levels, int proc)
{
  int iret;
  /* check if data is contiguous */
  if (armci_check_contiguous(src_stride_arr, dst_stride_arr, count, stride_levels)) {
    int i;
    int lcount = 1;
    for (i=0; i<=stride_levels; i++) lcount *= count[i];
    iret = comex_acc(optype, scale, src_ptr, dst_ptr, lcount, proc, COMEX_GROUP_WORLD);
  } else {
    iret = comex_accs(optype, scale, src_ptr, src_stride_arr, dst_ptr,
        dst_stride_arr, count, stride_levels, proc, COMEX_GROUP_WORLD);
  }
  return iret;
}